

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void __thiscall fmp4_stream::trun::print(trun *this)

{
  pointer psVar1;
  long lVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"==================trun=================");
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar2 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  poVar4 = std::operator<<((ostream *)&std::cout," magic conf                 ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar2 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  poVar4 = std::operator<<((ostream *)&std::cout," sample count:      ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar2 = std::cout;
  if (this->data_offset_present_ == true) {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21
    ;
    *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    poVar4 = std::operator<<((ostream *)&std::cout," data_offset:        ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->data_offset_);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  if (this->first_sample_flags_present_ == true) {
    poVar4 = std::operator<<((ostream *)&std::cout," first sample flags:        ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  lVar2 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  poVar4 = std::operator<<((ostream *)&std::cout," first sample flags present:  ");
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar2 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  poVar4 = std::operator<<((ostream *)&std::cout," sample duration present: ");
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar2 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  poVar4 = std::operator<<((ostream *)&std::cout," sample_size_present: ");
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar2 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  poVar4 = std::operator<<((ostream *)&std::cout," sample_flags_present: ");
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar2 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  poVar4 = std::operator<<((ostream *)&std::cout," sample_ct_offsets_present: ");
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar3 = 0;
  while( true ) {
    uVar5 = (ulong)uVar3;
    psVar1 = (this->m_sentry).
             super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_sentry).
                      super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 5) <= uVar5)
    break;
    (**psVar1[uVar5]._vptr_sample_entry)(psVar1 + uVar5);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void trun::print() const
	{
		std::cout << "==================trun=================" << std::endl;
		std::cout << std::setw(33) << std::left << " magic conf                 " << magic_conf_ << std::endl;
		std::cout << std::setw(33) << std::left << " sample count:      " << sample_count_ << std::endl;
		if (data_offset_present_)
			std::cout << std::setw(33) << std::left << " data_offset:        " << data_offset_ << std::endl;
		if (first_sample_flags_present_)
			std::cout << " first sample flags:        " << first_sample_flags_ << std::endl;

		std::cout << std::setw(33) << std::left << " first sample flags present:  " << first_sample_flags_present_ << std::endl;
		std::cout << std::setw(33) << std::left << " sample duration present: " << sample_duration_present_ << std::endl;
		std::cout << std::setw(33) << std::left << " sample_size_present: " << sample_size_present_ << std::endl;
		std::cout << std::setw(33) << std::left << " sample_flags_present: " << sample_flags_present_ << std::endl;
		std::cout << std::setw(33) << std::left << " sample_ct_offsets_present: " << sample_composition_time_offsets_present_ << std::endl;

		for (unsigned int i = 0; i < m_sentry.size(); i++)
			m_sentry[i].print();
	}